

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

uint8 * google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                  (int field_number,int32 value,uint8 *target)

{
  uint8 *puVar1;
  uint8 *target_local;
  int32 value_local;
  int field_number_local;
  
  puVar1 = WriteTagToArray(field_number,WIRETYPE_VARINT,target);
  puVar1 = WriteInt32NoTagToArray(value,puVar1);
  return puVar1;
}

Assistant:

inline uint8* WireFormatLite::WriteInt32ToArray(int field_number,
                                                int32 value,
                                                uint8* target) {
  target = WriteTagToArray(field_number, WIRETYPE_VARINT, target);
  return WriteInt32NoTagToArray(value, target);
}